

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
DirectChainedMap<TypeFunction_*>::DirectChainedMap
          (DirectChainedMap<TypeFunction_*> *this,Allocator *allocator)

{
  int iVar1;
  undefined4 extraout_var;
  
  this->allocator = allocator;
  if (allocator != (Allocator *)0x0) {
    this->bucketCount = 4;
    this->count = 0;
    iVar1 = (*allocator->_vptr_Allocator[2])(allocator);
    this->data = (Node *)CONCAT44(extraout_var,iVar1);
    NULLC::fillMemory((Node *)CONCAT44(extraout_var,iVar1),0,(ulong)this->bucketCount * 0x18);
    return;
  }
  __assert_fail("allocator",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x176,
                "DirectChainedMap<TypeFunction *>::DirectChainedMap(Allocator *) [Value = TypeFunction *]"
               );
}

Assistant:

DirectChainedMap(Allocator *allocator) : allocator(allocator)
	{
		assert(allocator);

		bucketCount = 4;
		count = 0;

		data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);
	}